

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O2

void __thiscall FParser::ErrorMessage(FParser *this,FString *msg)

{
  DFsScript *extraout_RAX;
  DFsScript *pDVar1;
  char *temp;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  
  pDVar1 = this->Script;
  pcVar2 = pDVar1->data;
  uVar3 = 0;
  if ((pcVar2 <= this->Rover) && (this->Rover <= pcVar2 + pDVar1->len)) goto LAB_004f9603;
  do {
    pcVar2 = msg->Chars;
    pcVar4 = "Script %d, line %d: %s";
    msg = (FString *)(ulong)(uint)pDVar1->scriptnum;
    FS_Error("Script %d, line %d: %s",msg,uVar3);
    pDVar1 = extraout_RAX;
    this = (FParser *)pcVar4;
LAB_004f9603:
    uVar3 = 0;
    for (; pcVar2 < this->LineStart; pcVar2 = pcVar2 + 1) {
      uVar3 = (ulong)((int)uVar3 + (uint)(*pcVar2 == '\n'));
    }
  } while( true );
}

Assistant:

void FParser::ErrorMessage(FString msg)
{
	int linenum = 0;

	// find the line number
	if(Rover >= Script->data && Rover <= Script->data+Script->len)
    {
		char *temp;
		for(temp = Script->data; temp<LineStart; temp++)
			if(*temp == '\n') linenum++;    // count EOLs
    }

	//lineinfo.Format("Script %d, line %d: ", Script->scriptnum, linenum);
	FS_Error("Script %d, line %d: %s", Script->scriptnum, linenum, msg.GetChars());
}